

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatVariadic.cpp
# Opt level: O1

pair<llvm::ReplacementItem,_llvm::StringRef> * __thiscall
llvm::formatv_object_base::splitLiteralAndReplacement
          (pair<llvm::ReplacementItem,_llvm::StringRef> *__return_storage_ptr__,
          formatv_object_base *this,StringRef Fmt)

{
  size_t *psVar1;
  undefined1 *puVar2;
  formatv_object_base *this_00;
  byte bVar3;
  void *pvVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  ulong uVar8;
  char *__n;
  size_t sVar9;
  char *pcVar10;
  StringRef Spec;
  undefined1 auStack_b0 [8];
  Optional<llvm::ReplacementItem> RI;
  size_t FindBegin;
  
  __n = Fmt.Data;
  psVar1 = &(__return_storage_ptr__->first).Index;
  puVar2 = &(__return_storage_ptr__->first).field_0x2d;
  this_00 = (formatv_object_base *)((long)&(this->Fmt).Data + 1);
  RI.Storage._64_8_ = __n + -1;
  pcVar10 = (__return_storage_ptr__->second).Data;
  sVar9 = (__return_storage_ptr__->second).Length;
  pcVar7 = (char *)0x0;
  do {
    if (__n < pcVar7 || (long)__n - (long)pcVar7 == 0) {
      (__return_storage_ptr__->second).Data = pcVar10;
      (__return_storage_ptr__->second).Length = sVar9;
      *psVar1 = 0;
      (__return_storage_ptr__->first).Align = 0;
      (__return_storage_ptr__->second).Data = (char *)0x0;
      (__return_storage_ptr__->second).Length = 0;
      (__return_storage_ptr__->first).Type = Literal;
      (__return_storage_ptr__->first).Spec.Data = (char *)this;
      (__return_storage_ptr__->first).Spec.Length = (size_t)__n;
      (__return_storage_ptr__->first).Where = Right;
      (__return_storage_ptr__->first).Pad = '\0';
      *(undefined4 *)((long)&(__return_storage_ptr__->first).Options.Length + 4) = 0;
      *(ulong *)puVar2 = (ulong)(uint3)auStack_b0._0_3_;
      *(undefined8 *)((long)&(__return_storage_ptr__->first).Options.Data + 5) = 0;
      return __return_storage_ptr__;
    }
    pvVar4 = memchr(pcVar7 + (long)&this->Fmt,0x7b,(long)__n - (long)pcVar7);
    uVar8 = (long)pvVar4 - (long)this;
    pcVar5 = (char *)(-(ulong)(pvVar4 == (void *)0x0) | uVar8);
    if (pcVar5 == (char *)0x0) {
      pcVar6 = (char *)0x0;
      do {
        if (pcVar6[(long)&this->Fmt] != '{') goto LAB_00daebf2;
        pcVar6 = pcVar6 + 1;
      } while (__n != pcVar6);
      pcVar6 = (char *)0xffffffffffffffff;
LAB_00daebf2:
      if (__n < pcVar6) {
        pcVar6 = __n;
      }
      if ((char *)0x1 < pcVar6) {
        pcVar5 = (char *)((ulong)pcVar6 & 0xfffffffffffffffe);
        if (__n < pcVar5) {
          (__return_storage_ptr__->second).Data = pcVar10;
          (__return_storage_ptr__->second).Length = sVar9;
          __assert_fail("size() >= N && \"Dropping more elements than exist\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/StringRef.h"
                        ,0x281,"StringRef llvm::StringRef::drop_front(size_t) const");
        }
        pcVar10 = (char *)((ulong)pcVar6 >> 1);
        if (__n < (char *)((ulong)pcVar6 >> 1)) {
          pcVar10 = __n;
        }
        *psVar1 = 0;
        (__return_storage_ptr__->first).Align = 0;
        (__return_storage_ptr__->first).Type = Literal;
        (__return_storage_ptr__->first).Spec.Data = (char *)this;
        (__return_storage_ptr__->first).Spec.Length = (size_t)pcVar10;
        (__return_storage_ptr__->first).Where = Right;
        (__return_storage_ptr__->first).Pad = '\0';
        *(undefined4 *)((long)&(__return_storage_ptr__->first).Options.Length + 4) = 0;
        *(ulong *)puVar2 = (ulong)(uint3)auStack_b0._0_3_;
        *(undefined8 *)((long)&(__return_storage_ptr__->first).Options.Data + 5) = 0;
        goto LAB_00daec67;
      }
      pvVar4 = memchr(this,0x7d,(size_t)__n);
      if ((pvVar4 == (void *)0x0) ||
         (pcVar6 = (char *)((long)pvVar4 - (long)this), pcVar6 == (char *)0xffffffffffffffff)) {
        (__return_storage_ptr__->second).Data = pcVar10;
        (__return_storage_ptr__->second).Length = sVar9;
        __assert_fail("false && \"Unterminated brace sequence.  Escape with {{ for a literal brace.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/FormatVariadic.cpp"
                      ,0x75,
                      "static std::pair<ReplacementItem, StringRef> llvm::formatv_object_base::splitLiteralAndReplacement(StringRef)"
                     );
      }
      if ((__n < (char *)0x2) ||
         (pvVar4 = memchr(this_00,0x7b,RI.Storage._64_8_), pvVar4 == (void *)0x0)) {
        pcVar5 = (char *)0xffffffffffffffff;
      }
      else {
        pcVar5 = (char *)((long)pvVar4 - (long)this);
      }
      if (pcVar5 < pcVar6) {
        if (__n < pcVar5) {
          pcVar5 = __n;
        }
        *psVar1 = 0;
        (__return_storage_ptr__->first).Align = 0;
        (__return_storage_ptr__->first).Type = Literal;
        (__return_storage_ptr__->first).Spec.Data = (char *)this;
        (__return_storage_ptr__->first).Spec.Length = (size_t)pcVar5;
        (__return_storage_ptr__->first).Where = Right;
        (__return_storage_ptr__->first).Pad = '\0';
        goto LAB_00daebc3;
      }
      pcVar5 = pcVar6 + (pcVar6 == (char *)0x0);
      if (__n < pcVar6) {
        pcVar5 = __n;
      }
      Spec.Data = pcVar5 + -1;
      pcVar6 = pcVar6 + 1;
      Spec.Length = uVar8;
      parseReplacementItem((Optional<llvm::ReplacementItem> *)auStack_b0,this_00,Spec);
      if (RI.Storage.field_0.value.Options.Length._0_1_ == '\x01') {
        if (__n < pcVar6) {
          pcVar6 = __n;
        }
        sVar9 = (long)__n - (long)pcVar6;
        pcVar10 = pcVar6 + (long)this;
        (__return_storage_ptr__->first).Options.Data = (char *)RI.Storage.field_0._40_8_;
        (__return_storage_ptr__->first).Options.Length =
             (size_t)RI.Storage.field_0.value.Options.Data;
        (__return_storage_ptr__->first).Align = RI.Storage.field_0.value.Index;
        (__return_storage_ptr__->first).Where = RI.Storage.field_0.value.Align._0_4_;
        (__return_storage_ptr__->first).Pad = RI.Storage.field_0._36_1_;
        *(undefined3 *)&(__return_storage_ptr__->first).field_0x2d = RI.Storage.field_0._37_3_;
        (__return_storage_ptr__->first).Spec.Length =
             CONCAT53(RI.Storage.field_0._11_5_,RI.Storage.field_0._8_3_);
        (__return_storage_ptr__->first).Index = RI.Storage.field_0.value.Spec.Length;
        *(ulong *)&__return_storage_ptr__->first = CONCAT53(auStack_b0._3_5_,auStack_b0._0_3_);
        (__return_storage_ptr__->first).Spec.Data =
             (char *)CONCAT17(RI.Storage.field_0._7_1_,
                              CONCAT43(RI.Storage.field_0._3_4_,RI.Storage.field_0.value.Type._0_3_)
                             );
        pcVar6 = pcVar7;
      }
      bVar3 = RI.Storage.field_0.value.Options.Length._0_1_ ^ 1;
    }
    else {
      if (__n < pcVar5) {
        pcVar5 = __n;
      }
      *psVar1 = 0;
      (__return_storage_ptr__->first).Align = 0;
      (__return_storage_ptr__->first).Type = Literal;
      (__return_storage_ptr__->first).Spec.Data = (char *)this;
      (__return_storage_ptr__->first).Spec.Length = (size_t)pcVar5;
      (__return_storage_ptr__->first).Where = Right;
      (__return_storage_ptr__->first).Pad = '\0';
LAB_00daebc3:
      *(undefined4 *)((long)&(__return_storage_ptr__->first).Options.Length + 4) = 0;
      *(ulong *)puVar2 = (ulong)(uint3)auStack_b0._0_3_;
      *(undefined8 *)((long)&(__return_storage_ptr__->first).Options.Data + 5) = 0;
LAB_00daec67:
      RI.Storage.field_0._7_4_ = 0;
      RI.Storage.field_0._3_4_ = 0;
      RI.Storage.field_0.value.Type._0_3_ = 0;
      auStack_b0._3_5_ = 0;
      bVar3 = 0;
      pcVar10 = pcVar5 + (long)&this->Fmt;
      sVar9 = (long)__n - (long)pcVar5;
      pcVar6 = pcVar7;
    }
    pcVar7 = pcVar6;
    if (bVar3 == 0) {
      (__return_storage_ptr__->second).Data = pcVar10;
      (__return_storage_ptr__->second).Length = sVar9;
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

std::pair<ReplacementItem, StringRef>
formatv_object_base::splitLiteralAndReplacement(StringRef Fmt) {
  std::size_t From = 0;
  while (From < Fmt.size() && From != StringRef::npos) {
    std::size_t BO = Fmt.find_first_of('{', From);
    // Everything up until the first brace is a literal.
    if (BO != 0)
      return std::make_pair(ReplacementItem{Fmt.substr(0, BO)}, Fmt.substr(BO));

    StringRef Braces =
        Fmt.drop_front(BO).take_while([](char C) { return C == '{'; });
    // If there is more than one brace, then some of them are escaped.  Treat
    // these as replacements.
    if (Braces.size() > 1) {
      size_t NumEscapedBraces = Braces.size() / 2;
      StringRef Middle = Fmt.substr(BO, NumEscapedBraces);
      StringRef Right = Fmt.drop_front(BO + NumEscapedBraces * 2);
      return std::make_pair(ReplacementItem{Middle}, Right);
    }
    // An unterminated open brace is undefined.  We treat the rest of the string
    // as a literal replacement, but we assert to indicate that this is
    // undefined and that we consider it an error.
    std::size_t BC = Fmt.find_first_of('}', BO);
    if (BC == StringRef::npos) {
      assert(
          false &&
          "Unterminated brace sequence.  Escape with {{ for a literal brace.");
      return std::make_pair(ReplacementItem{Fmt}, StringRef());
    }

    // Even if there is a closing brace, if there is another open brace before
    // this closing brace, treat this portion as literal, and try again with the
    // next one.
    std::size_t BO2 = Fmt.find_first_of('{', BO + 1);
    if (BO2 < BC)
      return std::make_pair(ReplacementItem{Fmt.substr(0, BO2)},
                            Fmt.substr(BO2));

    StringRef Spec = Fmt.slice(BO + 1, BC);
    StringRef Right = Fmt.substr(BC + 1);

    auto RI = parseReplacementItem(Spec);
    if (RI.hasValue())
      return std::make_pair(*RI, Right);

    // If there was an error parsing the replacement item, treat it as an
    // invalid replacement spec, and just continue.
    From = BC + 1;
  }
  return std::make_pair(ReplacementItem{Fmt}, StringRef());
}